

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

int __thiscall
google::protobuf::Reflection::GetRepeatedEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int iVar4;
  Descriptor *pDVar5;
  int *piVar6;
  undefined4 in_ECX;
  FieldDescriptor *in_RDX;
  Message *in_RDI;
  int value;
  char *in_stack_00000058;
  char *in_stack_00000060;
  undefined4 in_stack_00000068;
  CppType in_stack_0000006c;
  Descriptor *in_stack_00000070;
  FieldDescriptor *in_stack_00000078;
  Descriptor *in_stack_00000080;
  int in_stack_000000d8;
  int in_stack_000000dc;
  ExtensionSet *in_stack_000000e0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Reflection *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  pDVar5 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar5 != (Descriptor *)(in_RDI->super_MessageLite)._vptr_MessageLite) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,(FieldDescriptor *)CONCAT44(in_stack_0000006c,in_stack_00000068),
               in_stack_00000060,in_stack_00000058);
  }
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,(FieldDescriptor *)CONCAT44(in_stack_0000006c,in_stack_00000068),
               in_stack_00000060,in_stack_00000058);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x42aa3e);
  if (CVar3 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (in_stack_00000080,in_stack_00000078,(char *)in_stack_00000070,in_stack_0000006c);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    GetExtensionSet(in_stack_ffffffffffffffd0,
                    (Message *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    FieldDescriptor::number(in_RDX);
    iVar4 = internal::ExtensionSet::GetRepeatedEnum
                      (in_stack_000000e0,in_stack_000000dc,in_stack_000000d8);
  }
  else {
    piVar6 = GetRepeatedField<int>
                       ((Reflection *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI,
                        (FieldDescriptor *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    iVar4 = *piVar6;
  }
  return iVar4;
}

Assistant:

int Reflection::GetRepeatedEnumValue(const Message& message,
                                     const FieldDescriptor* field,
                                     int index) const {
  USAGE_CHECK_ALL(GetRepeatedEnumValue, REPEATED, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetRepeatedEnum(field->number(), index);
  } else {
    value = GetRepeatedField<int>(message, field, index);
  }
  return value;
}